

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O0

void __thiscall
trimesh::mscomplex_t::set_critpt
          (mscomplex_t *this,int i,cellid_t c,char idx,fn_t f,cellid_t v,bool b)

{
  value_type vVar1;
  value_type vVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  double *pdVar6;
  bool b_local;
  fn_t fStack_28;
  cellid_t v_local;
  fn_t f_local;
  cellid_t local_18;
  int iStack_14;
  char idx_local;
  cellid_t c_local;
  int i_local;
  mscomplex_t *this_local;
  
  fStack_28 = f;
  f_local._7_1_ = idx;
  local_18 = c;
  iStack_14 = i;
  _c_local = this;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_cp_cellid,(long)i);
  *pvVar3 = c;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_cp_vertid,(long)iStack_14);
  vVar2 = f_local._7_1_;
  *pvVar3 = v;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_cp_index,(long)iStack_14);
  vVar1 = fStack_28;
  *pvVar4 = vVar2;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->m_cp_fn,(long)iStack_14);
  *pvVar5 = vVar1;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     (&this->m_cp_is_boundry,(long)iStack_14);
  *pvVar4 = b;
  pdVar6 = std::max<double>(&stack0xffffffffffffffd8,&this->m_fmax);
  this->m_fmax = *pdVar6;
  pdVar6 = std::min<double>(&stack0xffffffffffffffd8,&this->m_fmin);
  this->m_fmin = *pdVar6;
  return;
}

Assistant:

void mscomplex_t::set_critpt
(int i, cellid_t c, char idx, fn_t f, cellid_t v, bool b)
{
  m_cp_cellid[i]     = c;
  m_cp_vertid[i]     = v;
  m_cp_index[i]      = idx;
  m_cp_fn[i]         = f;
  m_cp_is_boundry[i] = b;

  m_fmax = std::max(f,m_fmax);
  m_fmin = std::min(f,m_fmin);
}